

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

void libtorrent::aux::escape_string(string *ret,char *str,int len)

{
  bool bVar1;
  char local_27 [3];
  int local_24;
  char tmp [3];
  int i;
  int len_local;
  char *str_local;
  string *ret_local;
  
  bVar1 = ::std::
          any_of<char_const*,libtorrent::aux::escape_string(std::__cxx11::string&,char_const*,int)::__0>
                    (str,str + len);
  if (bVar1) {
    for (local_24 = 0; local_24 < len; local_24 = local_24 + 1) {
      snprintf(local_27,3,"%02x",(ulong)(byte)str[local_24]);
      ::std::__cxx11::string::operator+=((string *)ret,local_27);
    }
  }
  else {
    ::std::__cxx11::string::assign((char *)ret,(ulong)str);
  }
  return;
}

Assistant:

void escape_string(std::string& ret, char const* str, int len)
	{
		if (std::any_of(str, str + len, [](char const c) { return c < 32 || c >= 127; } ))
		{
			for (int i = 0; i < len; ++i)
			{
				char tmp[3];
				std::snprintf(tmp, sizeof(tmp), "%02x", std::uint8_t(str[i]));
				ret += tmp;
			}
		}
		else
		{
			ret.assign(str, std::size_t(len));
		}
	}